

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O3

bool Am_Replace_Placeholders
               (Am_Object *cmd,Am_Slot_Key slot,bool *did_a_replace,Am_Value *orig_value,
               Am_Value *new_value,Am_Object *sel_widget)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  unsigned_short uVar4;
  Am_Value *pAVar5;
  ostream *poVar6;
  Am_Wrapper *in_value;
  bool *pbVar7;
  Am_Value_List new_list;
  Am_Object ph;
  Am_Value_List orig_list;
  Am_Value ret_val;
  Am_Value val;
  Am_Placeholder_Replace_Method replace_method;
  Am_Value_List local_c8;
  Am_Object local_b8;
  undefined4 local_ac;
  Am_Value_List local_a8;
  Am_Value local_98;
  Am_Value local_88;
  bool *local_78;
  Am_Object local_70;
  Am_Object *local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Value_List local_50;
  Am_Placeholder_Replace_Method local_40;
  
  local_78 = did_a_replace;
  pAVar5 = Am_Object::Get(cmd,slot,1);
  Am_Value::operator=(orig_value,pAVar5);
  if (am_sdebug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Checking placeholders for cmd ",0x1e);
    poVar6 = operator<<((ostream *)&std::cout,cmd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," slot ",6);
    local_88.type = slot;
    poVar6 = operator<<(poVar6,(Am_Am_Slot_Key *)&local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," orig value ",0xc);
    poVar6 = operator<<(poVar6,orig_value);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::ostream::flush();
  }
  local_88.type = 0;
  local_88.value.wrapper_value = (Am_Wrapper *)0x0;
  local_98.type = 0;
  local_98.value.wrapper_value = (Am_Wrapper *)0x0;
  *local_78 = false;
  local_b8.data = (Am_Object_Data *)0x0;
  pbVar7 = local_78;
  bVar1 = Am_Value::Valid(orig_value);
  local_ac = (undefined4)CONCAT71((int7)((ulong)pbVar7 >> 8),1);
  if (!bVar1) goto LAB_001f16fb;
  bVar1 = Am_Value_List::Test(orig_value);
  if (bVar1) {
    Am_Value_List::Am_Value_List(&local_a8,orig_value);
    local_68 = sel_widget;
    Am_Value_List::Start(&local_a8);
    while( true ) {
      bVar1 = Am_Value_List::Last(&local_a8);
      if (bVar1) break;
      pAVar5 = Am_Value_List::Get(&local_a8);
      Am_Value::operator=(&local_88,pAVar5);
      if (local_88.type == 0xa001) {
        Am_Object::Am_Object((Am_Object *)&local_c8,&local_88);
        Am_Object::Am_Object(&local_58,&Am_A_Placeholder);
        bVar1 = Am_Object::Is_Instance_Of((Am_Object *)&local_c8,&local_58);
        Am_Object::~Am_Object(&local_58);
        Am_Object::~Am_Object((Am_Object *)&local_c8);
        if (bVar1) {
          Am_Value_List::Am_Value_List(&local_c8);
          Am_Value_List::Start(&local_a8);
          goto LAB_001f1527;
        }
      }
      Am_Value_List::Next(&local_a8);
    }
    Am_Value_List::~Am_Value_List(&local_a8);
    goto LAB_001f16fb;
  }
  if (orig_value->type != 0xa001) goto LAB_001f16fb;
  Am_Object::Am_Object((Am_Object *)&local_a8,orig_value);
  Am_Object::Am_Object(&local_70,&Am_A_Placeholder);
  bVar1 = Am_Object::Is_Instance_Of((Am_Object *)&local_a8,&local_70);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object((Am_Object *)&local_a8);
  if (!bVar1) goto LAB_001f16fb;
  Am_Object::operator=(&local_b8,orig_value);
  pAVar5 = Am_Object::Get(&local_b8,Am_PLACEHOLDER_REPLACE_METHOD,0);
  Am_Placeholder_Replace_Method::Am_Placeholder_Replace_Method
            ((Am_Placeholder_Replace_Method *)&local_a8,pAVar5);
  cVar2 = (*(code *)local_a8.item)(&local_b8,new_value,sel_widget);
  bVar1 = Am_Value_List::Test(new_value);
  if (bVar1) {
    Am_Value_List::Am_Value_List(&local_c8,new_value);
    uVar4 = Am_Value_List::Length(&local_c8);
    Am_Value_List::~Am_Value_List(&local_c8);
    if (uVar4 == 1) {
      Am_Value_List::Am_Value_List(&local_c8,new_value);
      Am_Value_List::Start(&local_c8);
      pAVar5 = Am_Value_List::Get(&local_c8);
      Am_Value::operator=(new_value,pAVar5);
      Am_Value_List::~Am_Value_List(&local_c8);
    }
  }
  if (cVar2 != '\0') {
    *local_78 = true;
    if (am_sdebug == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Found one placeholder and replaced with ",0x28);
      poVar6 = operator<<((ostream *)&std::cout,new_value);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::ostream::flush();
    }
    goto LAB_001f16fb;
  }
  goto LAB_001f16f3;
LAB_001f1527:
  bVar1 = Am_Value_List::Last(&local_a8);
  if (bVar1) goto LAB_001f1677;
  pAVar5 = Am_Value_List::Get(&local_a8);
  Am_Value::operator=(&local_88,pAVar5);
  if (local_88.type == 0xa001) {
    Am_Object::Am_Object((Am_Object *)&local_40,&local_88);
    Am_Object::Am_Object(&local_60,&Am_A_Placeholder);
    bVar3 = Am_Object::Is_Instance_Of((Am_Object *)&local_40,&local_60);
    Am_Object::~Am_Object(&local_60);
    Am_Object::~Am_Object((Am_Object *)&local_40);
    if (!bVar3) goto LAB_001f1638;
    Am_Object::operator=(&local_b8,&local_88);
    pAVar5 = Am_Object::Get(&local_b8,Am_PLACEHOLDER_REPLACE_METHOD,0);
    Am_Placeholder_Replace_Method::Am_Placeholder_Replace_Method(&local_40,pAVar5);
    bVar3 = (*local_40.Call)(&local_b8,&local_98,local_68);
    if (!bVar3) goto LAB_001f16db;
    bVar1 = Am_Value::Valid(&local_98);
    if (bVar1) {
      bVar1 = Am_Value_List::Test(&local_98);
      if (bVar1) {
        Am_Value_List::Am_Value_List(&local_50,&local_98);
        Am_Value_List::Append(&local_c8,&local_50,true);
        Am_Value_List::~Am_Value_List(&local_50);
      }
      else {
        Am_Value_List::Add(&local_c8,&local_98,Am_TAIL,true);
      }
    }
  }
  else {
LAB_001f1638:
    Am_Value_List::Add(&local_c8,&local_88,Am_TAIL,true);
  }
  Am_Value_List::Next(&local_a8);
  goto LAB_001f1527;
LAB_001f1677:
  *local_78 = true;
  in_value = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_c8);
  Am_Value::operator=(new_value,in_value);
  if (am_sdebug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Found placeholders in list and replaced with ",0x2d);
    poVar6 = operator<<((ostream *)&std::cout,new_value);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::ostream::flush();
  }
LAB_001f16db:
  Am_Value_List::~Am_Value_List(&local_c8);
  Am_Value_List::~Am_Value_List(&local_a8);
  if (bVar1) goto LAB_001f16fb;
LAB_001f16f3:
  local_ac = 0;
LAB_001f16fb:
  Am_Object::~Am_Object(&local_b8);
  Am_Value::~Am_Value(&local_98);
  Am_Value::~Am_Value(&local_88);
  return SUB41(local_ac,0);
}

Assistant:

bool
Am_Replace_Placeholders(Am_Object &cmd, Am_Slot_Key slot, bool &did_a_replace,
                        Am_Value &orig_value, Am_Value &new_value,
                        Am_Object &sel_widget)
{
  orig_value = cmd.Peek(slot);
  if (am_sdebug)
    std::cout << "Checking placeholders for cmd " << cmd << " slot "
              << Am_Am_Slot_Key(slot) << " orig value " << orig_value
              << std::endl
              << std::flush;
  Am_Value val, ret_val;
  bool ok;
  did_a_replace = false;
  Am_Object ph;
  if (!orig_value.Valid())
    return true; //nothing to do, and is OK
  else if (Am_Value_List::Test(orig_value)) {
    Am_Value_List orig_list = orig_value;
    //first, search to see if any placeholders
    bool found_one = false;
    for (orig_list.Start(); !orig_list.Last(); orig_list.Next()) {
      val = orig_list.Get();
      if (val.type == Am_OBJECT &&
          Am_Object(val).Is_Instance_Of(Am_A_Placeholder)) {
        found_one = true;
        break;
      }
    }
    if (!found_one)
      return true;
    else {
      Am_Value_List new_list;
      for (orig_list.Start(); !orig_list.Last(); orig_list.Next()) {
        val = orig_list.Get();
        if (val.type == Am_OBJECT &&
            Am_Object(val).Is_Instance_Of(Am_A_Placeholder)) {
          ph = val;
          Am_Placeholder_Replace_Method replace_method =
              ph.Get(Am_PLACEHOLDER_REPLACE_METHOD);
          ok = replace_method.Call(ph, ret_val, sel_widget);
          if (!ok)
            return false;
          if (ret_val.Valid()) { //otherwise, leave new_list without ret_val
            if (Am_Value_List::Test(ret_val))
              new_list.Append(ret_val);
            else
              new_list.Add(ret_val);
          }
        } else
          new_list.Add(val);
      }
      did_a_replace = true;
      new_value = new_list;
      if (am_sdebug)
        std::cout << "Found placeholders in list and replaced with "
                  << new_value << std::endl
                  << std::flush;
    }
  } else { //not a list
    if (orig_value.type == Am_OBJECT &&
        Am_Object(orig_value).Is_Instance_Of(Am_A_Placeholder)) {
      ph = orig_value;
      Am_Placeholder_Replace_Method replace_method =
          ph.Get(Am_PLACEHOLDER_REPLACE_METHOD);
      ok = replace_method.Call(ph, new_value, sel_widget);
      if (Am_Value_List::Test(new_value) &&
          Am_Value_List(new_value).Length() == 1) {
        Am_Value_List l = new_value;
        l.Start();
        new_value = l.Get();
      }
      if (!ok)
        return false;
      did_a_replace = true;
      if (am_sdebug)
        std::cout << "Found one placeholder and replaced with " << new_value
                  << std::endl
                  << std::flush;
    }
  }
  return true;
}